

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
write_double<long_double>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *this,
          longdouble value,format_specs *spec)

{
  alignment aVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined3 uVar5;
  basic_buffer<char> *pbVar4;
  char *pcVar6;
  size_t sVar7;
  ulong uVar8;
  char cVar9;
  size_t size;
  longdouble lVar10;
  float_spec_handler<char> handler;
  align_spec as;
  format_specs normalized_spec;
  write_inf_or_nan_t write_inf_or_nan;
  float_spec_handler<char> local_2c2;
  align_spec local_2c0;
  longdouble local_2b0;
  size_t local_2a0;
  undefined1 local_298 [16];
  undefined1 local_288 [20];
  byte bStack_274;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *local_270;
  undefined1 local_268 [13];
  undefined3 uStack_25b;
  undefined5 uStack_258;
  char local_250;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  local_2c2.type = spec->type_;
  local_2c2.upper = false;
  if ((byte)local_2c2.type < 0x61) {
    switch(local_2c2.type) {
    case 'A':
    case 'E':
    case 'F':
    case 'G':
      local_2c2.upper = true;
      break;
    case 'B':
    case 'C':
    case 'D':
switchD_00146c5e_caseD_42:
      local_2b0 = value;
      float_spec_handler<char>::on_error(&local_2c2);
      value = local_2b0;
      break;
    default:
      if (local_2c2.type != 0) goto switchD_00146c5e_caseD_42;
LAB_00146c79:
      local_2c2.type = 0x67;
    }
  }
  else if ((1 < (byte)local_2c2.type - 0x65) && (local_2c2.type != 0x61)) {
    if (local_2c2.type == 0x67) goto LAB_00146c79;
    goto switchD_00146c5e_caseD_42;
  }
  local_298._8_2_ = (undefined2)((unkuint10)value >> 0x40);
  if ((short)local_298._8_2_ < 0) {
    lVar10 = -value;
    cVar9 = '-';
  }
  else {
    lVar10 = value;
    if ((spec->flags_ & 1) == 0) {
      cVar9 = '\0';
    }
    else {
      cVar9 = '+';
      if ((spec->flags_ & 2) == 0) {
        cVar9 = ' ';
      }
    }
  }
  local_268._0_4_ = (spec->super_align_spec).width_;
  local_268._4_4_ = (spec->super_align_spec).fill_;
  local_268._8_5_ = (undefined5)*(undefined8 *)&(spec->super_align_spec).align_;
  uVar3 = *(undefined8 *)((long)&spec->flags_ + 1);
  uStack_25b = (undefined3)uVar3;
  uStack_258 = (undefined5)((ulong)uVar3 >> 0x18);
  local_298._0_10_ = value;
  local_270 = this;
  local_250 = cVar9;
  if (NAN(lVar10)) {
    pcVar6 = "NAN";
    local_248.super_basic_buffer<char>.ptr_ = "nan";
LAB_00146d0b:
    if (local_2c2.upper != false) {
      local_248.super_basic_buffer<char>.ptr_ = pcVar6;
    }
    local_248.super_basic_buffer<char>._vptr_basic_buffer =
         (_func_int **)CONCAT71(local_248.super_basic_buffer<char>._vptr_basic_buffer._1_7_,cVar9);
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
    write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::inf_or_nan_writer>
              ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)
               this,4 - (ulong)(cVar9 == '\0'),(align_spec *)local_268,
               (inf_or_nan_writer *)&local_248);
    return;
  }
  if ((longdouble)INFINITY <= lVar10) {
    pcVar6 = "INF";
    local_248.super_basic_buffer<char>.ptr_ = "inf";
    goto LAB_00146d0b;
  }
  local_248.super_basic_buffer<char>.size_ = 0;
  local_248.super_basic_buffer<char>._vptr_basic_buffer = (_func_int **)&PTR_grow_00178c20;
  local_248.super_basic_buffer<char>.capacity_ = 500;
  uVar2 = spec->precision_;
  uVar5 = *(undefined3 *)&spec->field_0x15;
  local_288._0_4_ = (spec->super_align_spec).width_;
  local_288._4_4_ = (spec->super_align_spec).fill_;
  local_288._8_8_ = *(undefined8 *)&(spec->super_align_spec).align_;
  stack0xfffffffffffffd88 =
       (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
       CONCAT35(uVar5,CONCAT14(local_2c2.type,uVar2));
  local_248.super_basic_buffer<char>.ptr_ = local_248.store_;
  write_double_sprintf<long_double>
            (this,lVar10,(format_specs *)local_288,&local_248.super_basic_buffer<char>);
  size = local_248.super_basic_buffer<char>.size_;
  local_2c0.align_ = (spec->super_align_spec).align_;
  local_2c0.width_ = (spec->super_align_spec).width_;
  local_2c0.fill_ = (spec->super_align_spec).fill_;
  aVar1 = (spec->super_align_spec).align_;
  if (aVar1 == ALIGN_DEFAULT) {
    local_2c0.align_ = ALIGN_RIGHT;
  }
  else if (aVar1 == ALIGN_NUMERIC) {
    if (cVar9 != '\0') {
      pbVar4 = (this->out_).container;
      sVar7 = pbVar4->size_;
      uVar8 = sVar7 + 1;
      if (pbVar4->capacity_ < uVar8) {
        local_2b0 = (longdouble)CONCAT28(local_2b0._8_2_,uVar8);
        local_2a0 = sVar7;
        (**pbVar4->_vptr_basic_buffer)(pbVar4,uVar8);
        sVar7 = local_2a0;
        uVar8 = local_2b0._0_8_;
      }
      pbVar4->size_ = uVar8;
      pbVar4->ptr_[sVar7] = cVar9;
      if (local_2c0.width_ != 0) {
        local_2c0.width_ = local_2c0.width_ - 1;
      }
    }
    local_2c0.align_ = ALIGN_RIGHT;
    cVar9 = '\0';
    goto LAB_00146e28;
  }
  size = (local_248.super_basic_buffer<char>.size_ + 1) - (ulong)(cVar9 == '\0');
LAB_00146e28:
  local_288[8] = cVar9;
  unique0x00005300 = &local_248;
  local_288._0_8_ = size;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
  write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::double_writer>
            ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)this
             ,size,&local_2c0,(double_writer *)local_288);
  local_248.super_basic_buffer<char>._vptr_basic_buffer = (_func_int **)&PTR_grow_00178c20;
  if (local_248.super_basic_buffer<char>.ptr_ == local_248.store_) {
    return;
  }
  operator_delete(local_248.super_basic_buffer<char>.ptr_);
  return;
}

Assistant:

void basic_writer<Range>::write_double(T value, const format_specs &spec) {
  // Check type.
  float_spec_handler<char_type> handler(spec.type());
  internal::handle_float_type_spec(spec.type(), handler);

  char sign = 0;
  // Use isnegative instead of value < 0 because the latter is always
  // false for NaN.
  if (internal::fputil::isnegative(static_cast<double>(value))) {
    sign = '-';
    value = -value;
  } else if (spec.flag(SIGN_FLAG)) {
    sign = spec.flag(PLUS_FLAG) ? '+' : ' ';
  }

  struct write_inf_or_nan_t {
    basic_writer &writer;
    format_specs spec;
    char sign;
    void operator()(const char *str) const {
      writer.write_padded(INF_SIZE + (sign ? 1 : 0), spec,
                          inf_or_nan_writer{sign, str});
    }
  } write_inf_or_nan = {*this, spec, sign};

  // Format NaN and ininity ourselves because sprintf's output is not consistent
  // across platforms.
  if (internal::fputil::isnotanumber(value))
    return write_inf_or_nan(handler.upper ? "NAN" : "nan");
  if (internal::fputil::isinfinity(value))
    return write_inf_or_nan(handler.upper ? "INF" : "inf");

  basic_memory_buffer<char_type> buffer;
  char type = static_cast<char>(spec.type());
  if (internal::const_check(
        internal::use_grisu() && sizeof(T) <= sizeof(double)) &&
      type != 'a' && type != 'A') {
    char buf[100]; // TODO: correct buffer size
    size_t size = 0;
    internal::grisu2_format(static_cast<double>(value), buf, size, type,
                            spec.precision(), spec.flag(HASH_FLAG));
    FMT_ASSERT(size <= 100, "buffer overflow");
    buffer.append(buf, buf + size); // TODO: avoid extra copy
  } else {
    format_specs normalized_spec(spec);
    normalized_spec.type_ = handler.type;
    write_double_sprintf(value, normalized_spec, buffer);
  }
  size_t n = buffer.size();
  align_spec as = spec;
  if (spec.align() == ALIGN_NUMERIC) {
    if (sign) {
      auto &&it = reserve(1);
      *it++ = sign;
      sign = 0;
      if (as.width_)
        --as.width_;
    }
    as.align_ = ALIGN_RIGHT;
  } else {
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    if (sign)
      ++n;
  }
  write_padded(n, as, double_writer{n, sign, buffer});
}